

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O2

void test_2d_static<1ul,1ul>(void)

{
  int iVar1;
  _Head_base<1UL,_int,_false> local_58;
  _Head_base<0UL,_int,_false> local_54;
  tuple<int,_int> dptr [1];
  value_type true_idx;
  tuple<int,_int> *local_40;
  tuple<int,_int> *local_38;
  
  dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5b,"void test_2d_static() [X = 1UL, Y = 1UL]",(bool *)dptr,(bool *)&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int> = (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5d,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)dptr,(int *)&true_idx
            );
  dptr[0].super__Tuple_impl<0UL,_int,_int> = (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x5e,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)dptr,(int *)&true_idx
            );
  dptr[0].super__Tuple_impl<0UL,_int,_int> = (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)0x1;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x60,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)dptr,&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int> = (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)0x1;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x61,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)dptr,&true_idx);
  dptr[0].super__Tuple_impl<0UL,_int,_int> = (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)0x0;
  iVar1 = 0;
  while (iVar1 == 0) {
    local_58._M_head_impl = 0;
    for (local_54._M_head_impl = 0; local_54._M_head_impl == 0;
        local_54._M_head_impl = local_54._M_head_impl + 1) {
      true_idx = (value_type)local_58._M_head_impl;
      local_40 = (tuple<int,_int> *)true_idx;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x6b,"void test_2d_static() [X = 1UL, Y = 1UL]",(unsigned_long *)&local_40,
                 &true_idx);
      local_40 = dptr + (long)local_58._M_head_impl + (long)local_54._M_head_impl;
      local_38 = dptr + true_idx;
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x6d,"void test_2d_static() [X = 1UL, Y = 1UL]",&local_40,&local_38);
      dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
           local_54._M_head_impl;
      dptr[0].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)local_58._M_head_impl;
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x72,"void test_2d_static() [X = 1UL, Y = 1UL]",
                 &dptr[(long)local_58._M_head_impl + (long)local_54._M_head_impl].
                  super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl,
                 &local_54._M_head_impl);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x73,"void test_2d_static() [X = 1UL, Y = 1UL]",
                 (int *)(dptr + (long)local_58._M_head_impl + (long)local_54._M_head_impl),
                 &local_58._M_head_impl);
    }
    iVar1 = local_58._M_head_impl + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    tuple<int, int> dptr[X * Y];

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 
    }
}